

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O0

SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,1,Eigen::Stride<0,0>>const>>
::
lazyAssign<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>>
          (SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>>
           *this,DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                 *rhs)

{
  Index IVar1;
  Index IVar2;
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>
  *pCVar3;
  bool bVar4;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
  *rhs_local;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
  *this_local;
  
  IVar1 = SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
          ::rows((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                  *)this);
  IVar2 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
          ::rows((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                  *)rhs);
  bVar4 = false;
  if (IVar1 == IVar2) {
    IVar1 = SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
            ::cols((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                    *)this);
    IVar2 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
            ::cols((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                    *)rhs);
    bVar4 = IVar1 == IVar2;
  }
  if (!bVar4) {
    __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/SelfCwiseBinaryOp.h"
                  ,0x88,
                  "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Map<Eigen::Matrix<double, -1, 1>, 1>>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_sum_op<double>, Lhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, Rhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Map<Eigen::Matrix<double, -1, 1>, 1>>, RhsDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Map<Eigen::Matrix<double, -1, 1>, 1>>]"
                 );
  }
  pCVar3 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
           ::derived((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                      *)rhs);
  internal::
  assign_impl<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>,_3,_0,_0>
  ::run((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
         *)this,pCVar3);
  pCVar3 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
           ::derived((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
                      *)rhs);
  DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,1,Eigen::Stride<0,0>>const>>>
  ::
  checkTransposeAliasing<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>>
            ((DenseBase<Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,1,Eigen::Stride<0,0>>const>>>
              *)this,pCVar3);
  return (SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_Eigen::Stride<0,_0>_>_>_>
          *)this;
}

Assistant:

EIGEN_STRONG_INLINE SelfCwiseBinaryOp& lazyAssign(const DenseBase<RhsDerived>& rhs)
    {
      EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(Lhs,RhsDerived)
      EIGEN_CHECK_BINARY_COMPATIBILIY(BinaryOp,typename Lhs::Scalar,typename RhsDerived::Scalar);
      
    #ifdef EIGEN_DEBUG_ASSIGN
      internal::assign_traits<SelfCwiseBinaryOp, RhsDerived>::debug();
    #endif
      eigen_assert(rows() == rhs.rows() && cols() == rhs.cols());
      internal::assign_impl<SelfCwiseBinaryOp, RhsDerived>::run(*this,rhs.derived());
    #ifndef EIGEN_NO_DEBUG
      this->checkTransposeAliasing(rhs.derived());
    #endif
      return *this;
    }